

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O0

StatsByIP * __thiscall StatsByIP::CreateCopy(StatsByIP *this)

{
  StatsByIP *this_00;
  StatsByIP *x;
  StatsByIP *this_local;
  
  this_00 = (StatsByIP *)operator_new(0x58);
  StatsByIP(this_00,this->addr,this->addr_len,false,false,false,false);
  if (this_00 != (StatsByIP *)0x0) {
    this_00->hash = this->hash;
    this_00->nb_do = this->nb_do;
    this_00->nb_edns = this->nb_edns;
    this_00->nb_not_qname_mini = this->nb_not_qname_mini;
    this_00->nb_recursive_queries = this->nb_recursive_queries;
    this_00->nb_tcp_443 = this->nb_tcp_443;
    this_00->nb_tcp_583 = this->nb_tcp_583;
    this_00->query_seen = (bool)(this->query_seen & 1);
    this_00->response_seen = (bool)(this->response_seen & 1);
    this_00->option_mask = this->option_mask;
  }
  return this_00;
}

Assistant:

StatsByIP * StatsByIP::CreateCopy()
{
    StatsByIP * x = new StatsByIP(addr, addr_len, false, false, false, false);

    if (x != NULL)
    {
        x->hash = hash;
        x->nb_do = nb_do;
        x->nb_edns = nb_edns;
        x->nb_not_qname_mini = nb_not_qname_mini;
        x->nb_recursive_queries = nb_recursive_queries;
        x->nb_tcp_443 = nb_tcp_443;
        x->nb_tcp_583 = nb_tcp_583;
        x->query_seen = query_seen;
        x->response_seen = response_seen;
        x->option_mask = option_mask;
    }

    return x;
}